

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getValue<(TasGrid::TypeOneDRule)20>
                 (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double x)

{
  size_type sVar1;
  pointer *ppdVar2;
  size_t extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  ulong local_68;
  size_t i;
  double result;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> lag_less1;
  vector<double,_std::allocator<double>_> lag;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)20> *current_local;
  
  evalLagrange((vector<double,_std::allocator<double>_> *)
               &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&current->nodes,&current->coeff,x);
  evalLagrange((vector<double,_std::allocator<double>_> *)local_48,&current->nodes_less1,
               &current->coeff_less1,x);
  ppdVar2 = &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::back
            ((vector<double,_std::allocator<double>_> *)ppdVar2);
  ::std::abs((int)ppdVar2);
  local_68 = 0;
  i = extraout_XMM0_Qa;
  while( true ) {
    sVar1 = ::std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_48);
    if (sVar1 <= local_68) break;
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)local_48,local_68);
    ppdVar2 = &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)ppdVar2,local_68);
    ::std::abs((int)ppdVar2);
    i = (size_t)(extraout_XMM0_Qa_00 + (double)i);
    local_68 = local_68 + 1;
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (double)i;
}

Assistant:

double getValue<rule_mindeltaodd>(CurrentNodes<rule_mindeltaodd> const& current, double x){
    auto lag       = evalLagrange(current.nodes, current.coeff, x);
    auto lag_less1 = evalLagrange(current.nodes_less1, current.coeff_less1, x);

    double result = std::abs(lag.back());
    for(size_t i=0; i<lag_less1.size(); i++) {
        result += std::abs(lag_less1[i] - lag[i]);
    }
    return result;
}